

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O3

void __thiscall
optimization::const_merge::Merge_Const::spread_var(Merge_Const *this,VarId *var,int val)

{
  pair<int,_int> *ppVar1;
  Displayable DVar2;
  int iVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar6;
  pair<int,_int> *usepoint;
  pair<int,_int> *ppVar7;
  Inst *pIVar8;
  VarId local_58;
  pair<const_mir::inst::VarId,_int> local_48;
  
  sVar4 = std::
          map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::count(&env->usepoints,var);
  if (sVar4 != 0) {
    pmVar5 = std::
             map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::at(&env->usepoints,var);
    ppVar7 = (pmVar5->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (pmVar5->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar7 != ppVar1) {
      do {
        inst = Env::get_inst(env,*ppVar7);
        pIVar8 = (inst->_M_t).
                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        iVar3 = (*(pIVar8->super_Displayable)._vptr_Displayable[1])(pIVar8);
        DVar2._vptr_Displayable = (pIVar8->super_Displayable)._vptr_Displayable;
        if (iVar3 == 0) {
          if (DVar2._vptr_Displayable != (_func_int **)&PTR_display_001ecfe8) {
            pIVar8 = (Inst *)0x0;
          }
          if (*(char *)&pIVar8[2].super_Displayable._vptr_Displayable != '\0') {
            *(undefined1 *)&pIVar8[2].super_Displayable._vptr_Displayable = 0;
          }
          *(int *)&pIVar8[1].dest.super_Displayable._vptr_Displayable = val;
          *(undefined2 *)((long)&pIVar8[2].super_Displayable._vptr_Displayable + 1) = 1;
          local_48.first.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
          local_48.first.id = (pIVar8->dest).id;
          local_48.second = val;
          std::
          _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
          ::_M_insert_unique<std::pair<mir::inst::VarId_const,int>>
                    ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
                      *)&this->const_var_map,&local_48);
          local_58.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
          local_58.id = (pIVar8->dest).id;
          spread_var(this,&local_58,val);
        }
        else {
          if (DVar2._vptr_Displayable != (_func_int **)&PTR_display_001ed048) {
            pIVar8 = (Inst *)0x0;
          }
          if (*(char *)&pIVar8[2].super_Displayable._vptr_Displayable == '\x01') {
            pvVar6 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)&pIVar8[1].dest);
            if (pvVar6->id == var->id) {
              if (*(char *)&pIVar8[2].super_Displayable._vptr_Displayable != '\0') {
                *(undefined1 *)&pIVar8[2].super_Displayable._vptr_Displayable = 0;
              }
              *(int *)&pIVar8[1].dest.super_Displayable._vptr_Displayable = val;
              *(undefined2 *)((long)&pIVar8[2].super_Displayable._vptr_Displayable + 1) = 1;
            }
          }
          if (*(char *)&pIVar8[3].dest.super_Displayable._vptr_Displayable == '\x01') {
            pvVar6 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)&pIVar8[2].dest.id);
            if (pvVar6->id == var->id) {
              if (*(char *)&pIVar8[3].dest.super_Displayable._vptr_Displayable != '\0') {
                *(undefined1 *)&pIVar8[3].dest.super_Displayable._vptr_Displayable = 0;
              }
              pIVar8[2].dest.id = val;
              *(undefined2 *)((long)&pIVar8[3].dest.super_Displayable._vptr_Displayable + 1) = 1;
            }
          }
          if ((*(char *)&pIVar8[2].super_Displayable._vptr_Displayable == '\0') &&
             (*(char *)&pIVar8[3].dest.super_Displayable._vptr_Displayable == '\0')) {
            optimize_inst(this,inst);
          }
        }
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != ppVar1);
    }
  }
  return;
}

Assistant:

void spread_var(mir::inst::VarId var, int val) {
    if (!env->usepoints.count(var)) {
      return;
    }
    for (auto& usepoint : env->usepoints.at(var)) {
      auto& inst = env->get_inst(usepoint);
      auto& is = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Assign) {
        auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&is);
        assignInst->src = val;
        const_var_map.insert({assignInst->dest, val});
        spread_var(assignInst->dest, val);
      } else {
        auto opInst = dynamic_cast<mir::inst::OpInst*>(&is);
        if (opInst->lhs.index() == 1) {
          auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
          if (lhs.id == var.id) {
            opInst->lhs = val;
          }
        }
        if (opInst->rhs.index() == 1) {
          auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
          if (rhs.id == var.id) {
            opInst->rhs = val;
          }
        }
        if (opInst->lhs.index() == 0 && opInst->rhs.index() == 0) {
          optimize_inst(inst);
        }
      }
    }
  }